

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concur19.cc
# Opt level: O2

tuple<tchecker::algorithms::covreach::stats_t,_std::shared_ptr<tchecker::tck_reach::concur19::graph_t>_>
* tchecker::tck_reach::concur19::run
            (tuple<tchecker::algorithms::covreach::stats_t,_std::shared_ptr<tchecker::tck_reach::concur19::graph_t>_>
             *__return_storage_ptr__,system_declaration_t *sysdecl,string *labels,
            string *search_order,covering_t covering,size_t block_size,size_t table_size)

{
  bool bVar1;
  policy_t policy;
  system_t *this;
  ostream *poVar2;
  refzg_t *__p;
  graph_t *this_00;
  invalid_argument *this_01;
  algorithm_t algorithm;
  shared_ptr<tchecker::tck_reach::concur19::graph_t> graph;
  shared_ptr<tchecker::refzg::refzg_t> refzg;
  shared_ptr<const_tchecker::ta::system_t> system;
  stats_t stats;
  stats_t local_88;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> accepting_labels;
  
  this = (system_t *)operator_new(0x480);
  ta::system_t::system_t(this,sysdecl);
  std::__shared_ptr<tchecker::ta::system_t_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<tchecker::ta::system_t,void>
            ((__shared_ptr<tchecker::ta::system_t_const,(__gnu_cxx::_Lock_policy)2> *)&system,this);
  bVar1 = tchecker::system::every_process_has_initial_location
                    ((system_t *)
                     system.
                     super___shared_ptr<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  if (!bVar1) {
    poVar2 = tchecker::operator<<((ostream *)&std::cerr,(log_warning_t *)&log_warning);
    poVar2 = std::operator<<(poVar2,"system has no initial state");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  __p = tchecker::refzg::factory
                  (&system,SHARING,PROCESS_REFERENCE_CLOCKS,SYNC_ELAPSED_SEMANTICS,0x7fffffff,
                   block_size,table_size);
  std::__shared_ptr<tchecker::refzg::refzg_t,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<tchecker::refzg::refzg_t,void>
            ((__shared_ptr<tchecker::refzg::refzg_t,(__gnu_cxx::_Lock_policy)2> *)&refzg,__p);
  this_00 = (graph_t *)operator_new(0x140);
  graph_t::graph_t(this_00,&refzg,block_size,table_size);
  std::__shared_ptr<tchecker::tck_reach::concur19::graph_t,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<tchecker::tck_reach::concur19::graph_t,void>
            ((__shared_ptr<tchecker::tck_reach::concur19::graph_t,(__gnu_cxx::_Lock_policy)2> *)
             &graph,this_00);
  syncprod::system_t::labels
            (&accepting_labels,
             &(system.super___shared_ptr<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->super_system_t,labels);
  policy = algorithms::fast_remove_waiting_policy(search_order);
  algorithms::covreach::stats_t::stats_t(&stats);
  if (covering == COVERING_LEAF_NODES) {
    algorithms::covreach::
    algorithm_t<tchecker::refzg::refzg_t,_tchecker::tck_reach::concur19::graph_t>::
    run<(tchecker::algorithms::covreach::covering_t)1>
              (&local_88,
               (algorithm_t<tchecker::refzg::refzg_t,_tchecker::tck_reach::concur19::graph_t> *)
               &algorithm,
               refzg.super___shared_ptr<tchecker::refzg::refzg_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               ,graph.
                super___shared_ptr<tchecker::tck_reach::concur19::graph_t,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr,&accepting_labels,policy);
  }
  else {
    if (covering != COVERING_FULL) {
      this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (this_01,"Unknown covering policy for covreach algorithm");
      __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    algorithms::covreach::
    algorithm_t<tchecker::refzg::refzg_t,_tchecker::tck_reach::concur19::graph_t>::
    run<(tchecker::algorithms::covreach::covering_t)0>
              (&local_88,
               (algorithm_t<tchecker::refzg::refzg_t,_tchecker::tck_reach::concur19::graph_t> *)
               &algorithm,
               refzg.super___shared_ptr<tchecker::refzg::refzg_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               ,graph.
                super___shared_ptr<tchecker::tck_reach::concur19::graph_t,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr,&accepting_labels,policy);
  }
  stats._reachable = local_88._reachable;
  stats._covered_states = local_88._covered_states;
  stats._stored_states = local_88._stored_states;
  stats._visited_states = local_88._visited_states;
  stats._visited_transitions = local_88._visited_transitions;
  stats.super_stats_t._start_time.__d.__r = (duration)(duration)local_88.super_stats_t._start_time;
  stats.super_stats_t._end_time.__d.__r = (duration)(duration)local_88.super_stats_t._end_time;
  std::__shared_ptr<tchecker::tck_reach::concur19::graph_t,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr((__shared_ptr<tchecker::tck_reach::concur19::graph_t,_(__gnu_cxx::_Lock_policy)2> *)
               __return_storage_ptr__,
               &graph.
                super___shared_ptr<tchecker::tck_reach::concur19::graph_t,_(__gnu_cxx::_Lock_policy)2>
              );
  *(ulong *)&(__return_storage_ptr__->
             super__Tuple_impl<0UL,_tchecker::algorithms::covreach::stats_t,_std::shared_ptr<tchecker::tck_reach::concur19::graph_t>_>
             ).super__Head_base<0UL,_tchecker::algorithms::covreach::stats_t,_false>._M_head_impl.
             _reachable = CONCAT71(stats._49_7_,stats._reachable);
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_tchecker::algorithms::covreach::stats_t,_std::shared_ptr<tchecker::tck_reach::concur19::graph_t>_>
  ).super__Head_base<0UL,_tchecker::algorithms::covreach::stats_t,_false>._M_head_impl.
  _covered_states = stats._covered_states;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_tchecker::algorithms::covreach::stats_t,_std::shared_ptr<tchecker::tck_reach::concur19::graph_t>_>
  ).super__Head_base<0UL,_tchecker::algorithms::covreach::stats_t,_false>._M_head_impl.
  _stored_states = stats._stored_states;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_tchecker::algorithms::covreach::stats_t,_std::shared_ptr<tchecker::tck_reach::concur19::graph_t>_>
  ).super__Head_base<0UL,_tchecker::algorithms::covreach::stats_t,_false>._M_head_impl.
  _visited_states = stats._visited_states;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_tchecker::algorithms::covreach::stats_t,_std::shared_ptr<tchecker::tck_reach::concur19::graph_t>_>
  ).super__Head_base<0UL,_tchecker::algorithms::covreach::stats_t,_false>._M_head_impl.
  _visited_transitions = stats._visited_transitions;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_tchecker::algorithms::covreach::stats_t,_std::shared_ptr<tchecker::tck_reach::concur19::graph_t>_>
  ).super__Head_base<0UL,_tchecker::algorithms::covreach::stats_t,_false>._M_head_impl.super_stats_t
  ._start_time.__d.__r = (rep)stats.super_stats_t._start_time.__d.__r;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_tchecker::algorithms::covreach::stats_t,_std::shared_ptr<tchecker::tck_reach::concur19::graph_t>_>
  ).super__Head_base<0UL,_tchecker::algorithms::covreach::stats_t,_false>._M_head_impl.super_stats_t
  ._end_time.__d.__r = (rep)stats.super_stats_t._end_time.__d.__r;
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
            (&accepting_labels);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&graph.
              super___shared_ptr<tchecker::tck_reach::concur19::graph_t,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&refzg.super___shared_ptr<tchecker::refzg::refzg_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&system.super___shared_ptr<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return __return_storage_ptr__;
}

Assistant:

std::tuple<tchecker::algorithms::covreach::stats_t, std::shared_ptr<tchecker::tck_reach::concur19::graph_t>>
run(tchecker::parsing::system_declaration_t const & sysdecl, std::string const & labels, std::string const & search_order,
    tchecker::algorithms::covreach::covering_t covering, std::size_t block_size, std::size_t table_size)
{
  std::shared_ptr<tchecker::ta::system_t const> system{new tchecker::ta::system_t{sysdecl}};
  if (!tchecker::system::every_process_has_initial_location(system->as_system_system()))
    std::cerr << tchecker::log_warning << "system has no initial state" << std::endl;

  std::shared_ptr<tchecker::refzg::refzg_t> refzg{tchecker::refzg::factory(
      system, tchecker::ts::SHARING, tchecker::refzg::PROCESS_REFERENCE_CLOCKS, tchecker::refzg::SYNC_ELAPSED_SEMANTICS,
      tchecker::refdbm::UNBOUNDED_SPREAD, block_size, table_size)};

  std ::shared_ptr<tchecker::tck_reach::concur19::graph_t> graph{
      new tchecker::tck_reach::concur19::graph_t{refzg, block_size, table_size}};

  boost::dynamic_bitset<> accepting_labels = system->as_syncprod_system().labels(labels);

  enum tchecker::waiting::policy_t policy = tchecker::algorithms::fast_remove_waiting_policy(search_order);

  tchecker::algorithms::covreach::stats_t stats;
  tchecker::tck_reach::concur19::algorithm_t algorithm;

  if (covering == tchecker::algorithms::covreach::COVERING_FULL)
    stats = algorithm.run<tchecker::algorithms::covreach::COVERING_FULL>(*refzg, *graph, accepting_labels, policy);
  else if (covering == tchecker::algorithms::covreach::COVERING_LEAF_NODES)
    stats = algorithm.run<tchecker::algorithms::covreach::COVERING_LEAF_NODES>(*refzg, *graph, accepting_labels, policy);
  else
    throw std::invalid_argument("Unknown covering policy for covreach algorithm");

  return std::make_tuple(stats, graph);
}